

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

int __thiscall Pathie::Path::fnmatch(Path *this,char *__pattern,char *__name,int __flags)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string pattern_nstr;
  string nstr;
  string local_50;
  string local_30;
  
  utf8_to_filename(&local_30,&this->m_path);
  utf8_to_filename(&local_50,(string *)__pattern);
  iVar1 = ::fnmatch(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p,(int)__name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar2 = &local_30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar2) {
    operator_delete(local_30._M_dataplus._M_p);
    paVar2 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)paVar2 >> 8),iVar1 == 0);
}

Assistant:

bool Path::fnmatch(const std::string& pattern, int flags /* = 0 */) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string pattern_nstr = utf8_to_filename(pattern);
  return ::fnmatch(pattern_nstr.c_str(), nstr.c_str(), flags) == 0;
#elif defined(_WIN32)
  std::wstring utf16path = utf8_to_utf16(m_path);
  std::wstring utf16pattern = utf8_to_utf16(pattern);
  return PathMatchSpecW(utf16path.c_str(), utf16pattern.c_str());
#else
#error Unsupported system.
#endif
}